

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O1

void __thiscall nuraft::peer::set_snapshot_in_sync(peer *this,ptr<snapshot> *s,ulong timeout_ms)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  snapshot_sync_ctx *psVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_39;
  snapshot_sync_ctx *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  ulong local_28;
  int32 local_1c;
  
  local_28 = timeout_ms;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->snp_sync_ctx_lock_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    _Var3._M_pi = (this->snp_sync_ctx_).
                  super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (this->snp_sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->snp_sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_1c = ((this->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->id_;
    local_38 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::snapshot_sync_ctx,std::allocator<nuraft::snapshot_sync_ctx>,std::shared_ptr<nuraft::snapshot>const&,int,unsigned_long&>
              (&_Stack_30,&local_38,(allocator<nuraft::snapshot_sync_ctx> *)&local_39,s,&local_1c,
               &local_28);
    _Var3._M_pi = _Stack_30._M_pi;
    psVar1 = local_38;
    local_38 = (snapshot_sync_ctx *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->snp_sync_ctx_).
              super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->snp_sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = psVar1;
    (this->snp_sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    _Var3._M_pi = _Stack_30._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var3._M_pi = _Stack_30._M_pi;
    }
  }
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->snp_sync_ctx_lock_);
  return;
}

Assistant:

void set_snapshot_in_sync(const ptr<snapshot>& s,
                              ulong timeout_ms = 10 * 1000) {
        std::lock_guard<std::mutex> l(snp_sync_ctx_lock_);
        if (s == nilptr) {
            snp_sync_ctx_.reset();
        }
        else {
            snp_sync_ctx_ = cs_new<snapshot_sync_ctx>(s, get_id(), timeout_ms);
        }
    }